

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers_test.cpp
# Opt level: O2

void flatbuffers::tests::FlexBuffersFloatingPointTest(void)

{
  pointer buf;
  bool bVar1;
  double dVar2;
  Reference local_b78;
  Vector jvec;
  Reference jroot;
  Builder slb;
  Map jmap;
  Parser parser;
  
  flexbuffers::Builder::Builder(&slb,0x200,BUILDER_FLAG_SHARE_KEYS_AND_STRINGS);
  IDLOptions::IDLOptions((IDLOptions *)&jmap);
  Parser::Parser(&parser,(IDLOptions *)&jmap);
  IDLOptions::~IDLOptions((IDLOptions *)&jmap);
  flexbuffers::Builder::Clear(&slb);
  bVar1 = Parser::ParseFlexBuffer
                    (&parser,"{ a: [1.0, nan, inf, infinity, -inf, +inf, -infinity, 8.0] }",
                     (char *)0x0,&slb);
  TestEq<bool,bool>(bVar1,true,"\'parser.ParseFlexBuffer(jsontest, nullptr, &slb)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                    ,0xb5,"");
  flexbuffers::Builder::Finished(&slb);
  jroot = flexbuffers::GetRoot(&slb.buf_);
  flexbuffers::Builder::Finished(&slb);
  buf = slb.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  flexbuffers::Builder::Finished(&slb);
  bVar1 = flexbuffers::VerifyBuffer
                    (buf,(long)slb.buf_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)slb.buf_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'flexbuffers::VerifyBuffer(slb.GetBuffer().data(), slb.GetBuffer().size(), nullptr)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                    ,0xb9,"");
  flexbuffers::Reference::AsMap(&jmap,&jroot);
  local_b78 = flexbuffers::Map::operator[](&jmap,"a");
  flexbuffers::Reference::AsVector(&jvec,&local_b78);
  TestEq<int,unsigned_long>
            (8,jvec.super_Sized.size_,"\'8\' != \'jvec.size()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xbc,"");
  local_b78 = flexbuffers::Vector::operator[](&jvec,0);
  dVar2 = flexbuffers::Reference::AsDouble(&local_b78);
  TestEq<double,double>
            (1.0,dVar2,"\'1.0\' != \'jvec[0].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xbd,"");
  local_b78 = flexbuffers::Vector::operator[](&jvec,1);
  dVar2 = flexbuffers::Reference::AsDouble(&local_b78);
  TestEq<bool,bool>(true,(~(ulong)dVar2 & 0x7ff8000000000000) == 0,
                    "\'true\' != \'is_quiet_nan(jvec[1].AsDouble())\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                    ,0xbe,"");
  local_b78 = flexbuffers::Vector::operator[](&jvec,2);
  dVar2 = flexbuffers::Reference::AsDouble(&local_b78);
  TestEq<double,double>
            (INFINITY,dVar2,"\'infinity_d\' != \'jvec[2].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xbf,"");
  local_b78 = flexbuffers::Vector::operator[](&jvec,3);
  dVar2 = flexbuffers::Reference::AsDouble(&local_b78);
  TestEq<double,double>
            (INFINITY,dVar2,"\'infinity_d\' != \'jvec[3].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc0,"");
  local_b78 = flexbuffers::Vector::operator[](&jvec,4);
  dVar2 = flexbuffers::Reference::AsDouble(&local_b78);
  TestEq<double,double>
            (-INFINITY,dVar2,"\'-infinity_d\' != \'jvec[4].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc1,"");
  local_b78 = flexbuffers::Vector::operator[](&jvec,5);
  dVar2 = flexbuffers::Reference::AsDouble(&local_b78);
  TestEq<double,double>
            (INFINITY,dVar2,"\'+infinity_d\' != \'jvec[5].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc2,"");
  local_b78 = flexbuffers::Vector::operator[](&jvec,6);
  dVar2 = flexbuffers::Reference::AsDouble(&local_b78);
  TestEq<double,double>
            (-INFINITY,dVar2,"\'-infinity_d\' != \'jvec[6].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc3,"");
  local_b78 = flexbuffers::Vector::operator[](&jvec,7);
  dVar2 = flexbuffers::Reference::AsDouble(&local_b78);
  TestEq<double,double>
            (8.0,dVar2,"\'8.0\' != \'jvec[7].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc4,"");
  Parser::~Parser(&parser);
  flexbuffers::Builder::~Builder(&slb);
  return;
}

Assistant:

void FlexBuffersFloatingPointTest() {
#if defined(FLATBUFFERS_HAS_NEW_STRTOD) && (FLATBUFFERS_HAS_NEW_STRTOD > 0)
  flexbuffers::Builder slb(512,
                           flexbuffers::BUILDER_FLAG_SHARE_KEYS_AND_STRINGS);
  // Parse floating-point values from JSON:
  flatbuffers::Parser parser;
  slb.Clear();
  auto jsontest =
      "{ a: [1.0, nan, inf, infinity, -inf, +inf, -infinity, 8.0] }";
  TEST_EQ(parser.ParseFlexBuffer(jsontest, nullptr, &slb), true);
  auto jroot = flexbuffers::GetRoot(slb.GetBuffer());
  TEST_EQ(flexbuffers::VerifyBuffer(slb.GetBuffer().data(),
                                    slb.GetBuffer().size(), nullptr),
          true);
  auto jmap = jroot.AsMap();
  auto jvec = jmap["a"].AsVector();
  TEST_EQ(8, jvec.size());
  TEST_EQ(1.0, jvec[0].AsDouble());
  TEST_ASSERT(is_quiet_nan(jvec[1].AsDouble()));
  TEST_EQ(infinity_d, jvec[2].AsDouble());
  TEST_EQ(infinity_d, jvec[3].AsDouble());
  TEST_EQ(-infinity_d, jvec[4].AsDouble());
  TEST_EQ(+infinity_d, jvec[5].AsDouble());
  TEST_EQ(-infinity_d, jvec[6].AsDouble());
  TEST_EQ(8.0, jvec[7].AsDouble());
#endif
}